

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float tr4;
  float tr3;
  float tr2;
  float tr1;
  float ti4;
  float ti3;
  float ti2;
  float ti1;
  float cr4;
  float cr3;
  float cr2;
  float ci4;
  float ci3;
  float ci2;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int k;
  int i;
  float *wa2_local;
  float *wa1_local;
  float *ch_local;
  float *cc_local;
  int l1_local;
  int ido_local;
  
  iVar11 = l1 * ido;
  t3 = 0;
  t5 = 0;
  iVar12 = ido * 2;
  for (t1 = 0; t1 < l1; t1 = t1 + 1) {
    iVar13 = t5 + iVar12;
    fVar24 = cc[iVar13 + -1];
    fVar1 = cc[iVar13 + -1];
    fVar20 = cc[iVar13];
    fVar21 = cc[iVar13];
    fVar22 = cc[t5];
    fVar23 = cc[iVar12 + iVar13 + -1];
    fVar2 = cc[t5];
    fVar3 = cc[iVar12 + iVar13 + -1];
    ch[t3] = fVar2 + fVar3 + fVar24 + fVar1;
    ch[iVar11 + t3] = (fVar22 - fVar23) - (fVar20 + fVar21);
    iVar13 = iVar11 + iVar11 + t3;
    ch[iVar13] = (fVar2 + fVar3) - (fVar24 + fVar1);
    ch[iVar11 + iVar13] = (fVar22 - fVar23) + fVar20 + fVar21;
    t3 = ido + t3;
    t5 = ido * 4 + t5;
  }
  if (1 < ido) {
    if (ido != 2) {
      t3 = 0;
      for (t1 = 0; t1 < l1; t1 = t1 + 1) {
        t6 = t3 * 4 + iVar12;
        ci2 = (float)t3;
        t7 = t6 + iVar12;
        t5 = t6;
        t4 = t3 * 4;
        for (t0 = 2; t0 < ido; t0 = t0 + 2) {
          iVar13 = t4 + 2;
          iVar14 = t5 + 2;
          iVar15 = t6 + -2;
          iVar16 = t7 + -2;
          fVar17 = (float)((int)ci2 + 2);
          fVar24 = cc[iVar13];
          fVar1 = cc[iVar16];
          fVar20 = cc[iVar13];
          fVar21 = cc[iVar16];
          fVar22 = cc[iVar14];
          fVar23 = cc[iVar15];
          fVar2 = cc[iVar14];
          fVar3 = cc[iVar15];
          fVar4 = cc[t4 + 1];
          fVar5 = cc[t7 + -3];
          fVar19 = cc[t4 + 1];
          fVar6 = cc[t7 + -3];
          fVar7 = cc[t5 + 1];
          fVar8 = cc[t6 + -3];
          fVar9 = cc[t5 + 1];
          fVar10 = cc[t6 + -3];
          ch[(int)ci2 + 1] = fVar19 + fVar6 + fVar9 + fVar10;
          fVar19 = (fVar19 + fVar6) - (fVar9 + fVar10);
          ch[(int)fVar17] = (fVar20 - fVar21) + (fVar22 - fVar23);
          fVar20 = (fVar20 - fVar21) - (fVar22 - fVar23);
          fVar21 = (fVar4 - fVar5) - (fVar2 + fVar3);
          fVar22 = (fVar4 - fVar5) + fVar2 + fVar3;
          fVar23 = fVar24 + fVar1 + (fVar7 - fVar8);
          fVar24 = (fVar24 + fVar1) - (fVar7 - fVar8);
          iVar18 = (int)fVar17 + iVar11;
          ch[iVar18 + -1] = wa1[t0 + -2] * fVar21 + -(wa1[t0 + -1] * fVar23);
          ch[iVar18] = wa1[t0 + -2] * fVar23 + wa1[t0 + -1] * fVar21;
          iVar18 = iVar11 + iVar18;
          ch[iVar18 + -1] = wa2[t0 + -2] * fVar19 + -(wa2[t0 + -1] * fVar20);
          ch[iVar18] = wa2[t0 + -2] * fVar20 + wa2[t0 + -1] * fVar19;
          ch[iVar11 + iVar18 + -1] = wa3[t0 + -2] * fVar22 + -(wa3[t0 + -1] * fVar24);
          ch[iVar11 + iVar18] = wa3[t0 + -2] * fVar24 + wa3[t0 + -1] * fVar22;
          ci2 = fVar17;
          t7 = iVar16;
          t6 = iVar15;
          t5 = iVar14;
          t4 = iVar13;
        }
        t3 = ido + t3;
      }
      if (ido % 2 == 1) {
        return;
      }
    }
    t5 = ido + -1;
    t6 = ido * 3;
    t3 = ido;
    for (t1 = 0; t1 < l1; t1 = t1 + 1) {
      fVar24 = cc[t3];
      fVar1 = cc[t6];
      fVar20 = cc[t6];
      fVar21 = cc[t3];
      fVar22 = cc[t3 + -1];
      fVar23 = cc[t6 + -1];
      ch[t5] = cc[t3 + -1] + cc[t6 + -1] + cc[t3 + -1] + cc[t6 + -1];
      ch[iVar11 + t5] = dradb4::sqrt2 * ((fVar22 - fVar23) - (fVar24 + fVar1));
      iVar12 = iVar11 + iVar11 + t5;
      ch[iVar12] = (fVar20 - fVar21) + (fVar20 - fVar21);
      ch[iVar11 + iVar12] = -dradb4::sqrt2 * ((fVar22 - fVar23) + fVar24 + fVar1);
      t5 = ido + t5;
      t3 = ido * 4 + t3;
      t6 = ido * 4 + t6;
    }
  }
  return;
}

Assistant:

static void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2,float *wa3){
  static float sqrt2=1.414213562373095f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=0;
  t2=ido<<2;
  t3=0;
  t6=ido<<1;
  for(k=0;k<l1;k++){
    t4=t3+t6;
    t5=t1;
    tr3=cc[t4-1]+cc[t4-1];
    tr4=cc[t4]+cc[t4];
    tr1=cc[t3]-cc[(t4+=t6)-1];
    tr2=cc[t3]+cc[t4-1];
    ch[t5]=tr2+tr3;
    ch[t5+=t0]=tr1-tr4;
    ch[t5+=t0]=tr2-tr3;
    ch[t5+=t0]=tr1+tr4;
    t1+=ido;
    t3+=t2;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  for(k=0;k<l1;k++){
    t5=(t4=(t3=(t2=t1<<2)+t6))+t6;
    t7=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      t3+=2;
      t4-=2;
      t5-=2;
      t7+=2;
      ti1=cc[t2]+cc[t5];
      ti2=cc[t2]-cc[t5];
      ti3=cc[t3]-cc[t4];
      tr4=cc[t3]+cc[t4];
      tr1=cc[t2-1]-cc[t5-1];
      tr2=cc[t2-1]+cc[t5-1];
      ti4=cc[t3-1]-cc[t4-1];
      tr3=cc[t3-1]+cc[t4-1];
      ch[t7-1]=tr2+tr3;
      cr3=tr2-tr3;
      ch[t7]=ti2+ti3;
      ci3=ti2-ti3;
      cr2=tr1-tr4;
      cr4=tr1+tr4;
      ci2=ti1+ti4;
      ci4=ti1-ti4;

      ch[(t8=t7+t0)-1]=wa1[i-2]*cr2-wa1[i-1]*ci2;
      ch[t8]=wa1[i-2]*ci2+wa1[i-1]*cr2;
      ch[(t8+=t0)-1]=wa2[i-2]*cr3-wa2[i-1]*ci3;
      ch[t8]=wa2[i-2]*ci3+wa2[i-1]*cr3;
      ch[(t8+=t0)-1]=wa3[i-2]*cr4-wa3[i-1]*ci4;
      ch[t8]=wa3[i-2]*ci4+wa3[i-1]*cr4;
    }
    t1+=ido;
  }

  if(ido%2 == 1)return;

 L105:

  t1=ido;
  t2=ido<<2;
  t3=ido-1;
  t4=ido+(ido<<1);
  for(k=0;k<l1;k++){
    t5=t3;
    ti1=cc[t1]+cc[t4];
    ti2=cc[t4]-cc[t1];
    tr1=cc[t1-1]-cc[t4-1];
    tr2=cc[t1-1]+cc[t4-1];
    ch[t5]=tr2+tr2;
    ch[t5+=t0]=sqrt2*(tr1-ti1);
    ch[t5+=t0]=ti2+ti2;
    ch[t5+=t0]=-sqrt2*(tr1+ti1);

    t3+=ido;
    t1+=t2;
    t4+=t2;
  }
}